

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O2

void __thiscall pool_layer_t::activate(pool_layer_t *this)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  float *pfVar4;
  uint uVar5;
  int j;
  uint uVar6;
  uint _x;
  int z;
  int _z;
  uint _y;
  float local_5c;
  
  for (_x = 0; (int)_x < (this->super_layer_t).out.size.x; _x = _x + 1) {
    for (_y = 0; (int)_y < (this->super_layer_t).out.size.y; _y = _y + 1) {
      for (_z = 0; _z < (this->super_layer_t).out.size.z; _z = _z + 1) {
        uVar1 = this->stride;
        uVar3 = this->extend_filter;
        local_5c = -3.4028235e+38;
        for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
          for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
            pfVar4 = tensor_t<float>::get
                               (&(this->super_layer_t).in,uVar5 + (_x & 0xffff) * (uint)uVar1,
                                (uint)uVar1 * (_y & 0xffff) + uVar6,_z);
            auVar2 = vmaxss_avx(ZEXT416((uint)local_5c),ZEXT416((uint)*pfVar4));
            local_5c = auVar2._0_4_;
            uVar3 = this->extend_filter;
          }
        }
        pfVar4 = tensor_t<float>::get(&(this->super_layer_t).out,_x,_y,_z);
        *pfVar4 = local_5c;
      }
    }
  }
  return;
}

Assistant:

void activate() {
    for (int x = 0; x < out.size.x; x++) {
      for (int y = 0; y < out.size.y; y++) {
        for (int z = 0; z < out.size.z; z++) {
          point_t mapped = map_to_input({(uint16_t) x, (uint16_t) y, 0}, 0);
          float mval = -FLT_MAX;
          for (int i = 0; i < extend_filter; i++)
            for (int j = 0; j < extend_filter; j++) {
              float v = in(mapped.x + i, mapped.y + j, z);
              if (v > mval)
                mval = v;
            }
          out(x, y, z) = mval;
        }
      }
    }
  }